

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-data.hpp
# Opt level: O1

void __thiscall
helics::HandleManager::setHandleOption
          (HandleManager *this,InterfaceHandle handle,int32_t option,int32_t val)

{
  byte *pbVar1;
  _Map_pointer ppBVar2;
  reference pBVar3;
  uint16_t uVar4;
  iterator *piVar5;
  BaseType index;
  
  if (handle.hid < 0) {
    return;
  }
  ppBVar2 = (this->handles).
            super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_node;
  if ((int)((int)((ulong)((long)(this->handles).
                                super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                                ._M_impl.super__Deque_impl_data._M_start._M_last -
                         (long)(this->handles).
                               super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                               ._M_impl.super__Deque_impl_data._M_start._M_cur) >> 3) * 0x286bca1b +
           (int)((ulong)((long)(this->handles).
                               super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                               ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                        (long)(this->handles).
                              super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                              ._M_impl.super__Deque_impl_data._M_finish._M_first) >> 3) * 0x286bca1b
           + ((int)((ulong)((long)ppBVar2 -
                           (long)(this->handles).
                                 super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                                 ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) + -1 +
             (uint)(ppBVar2 == (_Map_pointer)0x0)) * 3) <= handle.hid) {
    return;
  }
  if (option < 0x19c) {
    if (option == 0x18d) {
      piVar5 = &(this->handles).
                super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                ._M_impl.super__Deque_impl_data._M_start;
      pBVar3 = std::
               _Deque_iterator<helics::BasicHandleInfo,_helics::BasicHandleInfo_&,_helics::BasicHandleInfo_*>
               ::operator[](piVar5,(ulong)(uint)handle.hid);
      if (val != 0) {
        pBVar3->flags = pBVar3->flags & 0xfeff;
        pBVar3 = std::
                 _Deque_iterator<helics::BasicHandleInfo,_helics::BasicHandleInfo_&,_helics::BasicHandleInfo_*>
                 ::operator[](piVar5,(ulong)(uint)handle.hid);
        *(byte *)&pBVar3->flags = (byte)pBVar3->flags | 4;
        return;
      }
      uVar4 = pBVar3->flags & 0xfffb;
    }
    else {
      if (option != 0x192) {
        return;
      }
      piVar5 = &(this->handles).
                super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                ._M_impl.super__Deque_impl_data._M_start;
      pBVar3 = std::
               _Deque_iterator<helics::BasicHandleInfo,_helics::BasicHandleInfo_&,_helics::BasicHandleInfo_*>
               ::operator[](piVar5,(ulong)(uint)handle.hid);
      if (val != 0) {
        pBVar3->flags = pBVar3->flags & 0xfffb;
        pBVar3 = std::
                 _Deque_iterator<helics::BasicHandleInfo,_helics::BasicHandleInfo_&,_helics::BasicHandleInfo_*>
                 ::operator[](piVar5,(ulong)(uint)handle.hid);
        pbVar1 = (byte *)((long)&pBVar3->flags + 1);
        *pbVar1 = *pbVar1 | 1;
        return;
      }
      uVar4 = pBVar3->flags & 0xfeff;
    }
  }
  else if (option == 0x19c) {
    pBVar3 = std::
             _Deque_iterator<helics::BasicHandleInfo,_helics::BasicHandleInfo_&,_helics::BasicHandleInfo_*>
             ::operator[](&(this->handles).
                           super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                           ._M_impl.super__Deque_impl_data._M_start,(ulong)(uint)handle.hid);
    if (val == 0) {
      uVar4 = pBVar3->flags & 0xff7f;
    }
    else {
      uVar4 = pBVar3->flags | 0x80;
    }
  }
  else {
    if (option != 0x1a6) {
      return;
    }
    piVar5 = &(this->handles).
              super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>.
              _M_impl.super__Deque_impl_data._M_start;
    pBVar3 = std::
             _Deque_iterator<helics::BasicHandleInfo,_helics::BasicHandleInfo_&,_helics::BasicHandleInfo_*>
             ::operator[](piVar5,(ulong)(uint)handle.hid);
    if (pBVar3->handleType != ENDPOINT) {
      return;
    }
    pBVar3 = std::
             _Deque_iterator<helics::BasicHandleInfo,_helics::BasicHandleInfo_&,_helics::BasicHandleInfo_*>
             ::operator[](piVar5,(ulong)(uint)handle.hid);
    if (val == 0) {
      uVar4 = pBVar3->flags & 0xbfff;
    }
    else {
      uVar4 = pBVar3->flags | 0x4000;
    }
  }
  pBVar3->flags = uVar4;
  return;
}

Assistant:

inline bool isValidIndex(sizeType testSize, const SizedDataType& vec)
{
    return ((testSize >= sizeType(0)) && (testSize < static_cast<sizeType>(vec.size())));
}